

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O1

void __thiscall CompareTest_LongVarint_Test::TestBody(CompareTest_LongVarint_Test *this)

{
  long lVar1;
  char *pcVar2;
  initializer_list<UnknownField> __l;
  initializer_list<UnknownField> __l_00;
  initializer_list<UnknownField> __l_01;
  initializer_list<UnknownField> __l_02;
  AssertionResult gtest_ar;
  allocator_type local_14a;
  allocator_type local_149;
  internal local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  upb_UnknownCompareResult local_138;
  upb_UnknownCompareResult local_134;
  vector<UnknownField,_std::allocator<UnknownField>_> local_130;
  vector<UnknownField,_std::allocator<UnknownField>_> local_118;
  vector<UnknownField,_std::allocator<UnknownField>_> local_100;
  UnknownField local_e8;
  undefined4 local_b8;
  undefined8 local_b0;
  undefined1 local_90;
  vector<UnknownField,_std::allocator<UnknownField>_> local_88;
  UnknownField local_70;
  undefined4 local_40;
  undefined8 local_38;
  undefined1 local_18;
  
  local_138 = kUpb_UnknownCompareResult_Equal;
  local_e8.field_number = 1;
  local_e8.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_u._M_first
  ._M_storage.val = (_Uninitialized<Varint,_true>)(Varint)0x7b;
  local_e8.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_index =
       '\x01';
  local_b8 = 2;
  local_b0 = 0x1c8;
  local_90 = 1;
  __l._M_len = 2;
  __l._M_array = &local_e8;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_88,__l,&local_149);
  local_70.field_number = 1;
  local_70.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_u._M_first
  ._M_storage.val = (_Uninitialized<Varint,_true>)(Varint)0x7b;
  local_70.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_index =
       '\0';
  local_40 = 2;
  local_38 = 0x1c8;
  local_18 = 0;
  __l_00._M_len = 2;
  __l_00._M_array = &local_70;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_100,__l_00,&local_14a);
  local_134 = CompareUnknown(&local_88,&local_100);
  testing::internal::CmpHelperEQ<upb_UnknownCompareResult,upb_UnknownCompareResult>
            (local_148,"kUpb_UnknownCompareResult_Equal",
             "CompareUnknown({{1, LongVarint(123)}, {2, LongVarint(456)}}, {{1, Varint(123)}, {2, Varint(456)}})"
             ,&local_138,&local_134);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_100);
  lVar1 = 0x38;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>::
    ~_Variant_storage((_Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       *)((long)&local_70.field_number + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_88);
  lVar1 = 0x38;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>::
    ~_Variant_storage((_Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       *)((long)&local_e8.field_number + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/compare_unknown_test.cc"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_e8._4_4_,local_e8.field_number) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8.field_number) + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_138 = kUpb_UnknownCompareResult_Equal;
  local_e8.field_number = 2;
  local_e8.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_u._M_first
  ._M_storage.val = (_Uninitialized<Varint,_true>)(Varint)0x1c8;
  local_e8.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_index =
       '\x01';
  local_b8 = 1;
  local_b0 = 0x7b;
  local_90 = 1;
  __l_01._M_len = 2;
  __l_01._M_array = &local_e8;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_118,__l_01,&local_149);
  local_70.field_number = 1;
  local_70.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_u._M_first
  ._M_storage.val = (_Uninitialized<Varint,_true>)(Varint)0x7b;
  local_70.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_index =
       '\0';
  local_40 = 2;
  local_38 = 0x1c8;
  local_18 = 0;
  __l_02._M_len = 2;
  __l_02._M_array = &local_70;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_130,__l_02,&local_14a);
  local_134 = CompareUnknown(&local_118,&local_130);
  testing::internal::CmpHelperEQ<upb_UnknownCompareResult,upb_UnknownCompareResult>
            (local_148,"kUpb_UnknownCompareResult_Equal",
             "CompareUnknown({{2, LongVarint(456)}, {1, LongVarint(123)}}, {{1, Varint(123)}, {2, Varint(456)}})"
             ,&local_138,&local_134);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_130);
  lVar1 = 0x38;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>::
    ~_Variant_storage((_Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       *)((long)&local_70.field_number + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_118);
  lVar1 = 0x38;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>::
    ~_Variant_storage((_Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       *)((long)&local_e8.field_number + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/compare_unknown_test.cc"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT44(local_e8._4_4_,local_e8.field_number) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8.field_number) + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  return;
}

Assistant:

TEST(CompareTest, LongVarint) {
  EXPECT_EQ(kUpb_UnknownCompareResult_Equal,
            CompareUnknown({{1, LongVarint(123)}, {2, LongVarint(456)}},
                           {{1, Varint(123)}, {2, Varint(456)}}));
  EXPECT_EQ(kUpb_UnknownCompareResult_Equal,
            CompareUnknown({{2, LongVarint(456)}, {1, LongVarint(123)}},
                           {{1, Varint(123)}, {2, Varint(456)}}));
}